

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DoFilter6_SSE2(__m128i *p2,__m128i *p1,__m128i *p0,__m128i *q0,__m128i *q1,__m128i *q2,
                   __m128i *mask,int hev_thresh)

{
  short sVar1;
  short sVar2;
  ushort uVar3;
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [16];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  uint uVar17;
  uint uVar18;
  undefined1 auVar19 [15];
  undefined1 auVar20 [13];
  undefined1 auVar21 [15];
  unkuint9 Var22;
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [13];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar32 [15];
  longlong lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [11];
  undefined1 auVar40 [11];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  __m128i a0_lo;
  __m128i a1_lo;
  __m128i f;
  __m128i not_hev;
  __m128i a0_hi;
  __m128i a1_hi;
  __m128i a2_hi;
  byte local_c8;
  byte bStack_c7;
  byte bStack_c6;
  byte bStack_c5;
  byte bStack_c4;
  byte bStack_c3;
  byte bStack_c2;
  byte bStack_c1;
  byte bStack_c0;
  byte bStack_bf;
  byte bStack_be;
  byte bStack_bd;
  byte bStack_bc;
  byte bStack_bb;
  byte bStack_ba;
  byte bStack_b9;
  byte local_b8;
  byte bStack_b7;
  byte bStack_b6;
  byte bStack_b5;
  byte bStack_b4;
  byte bStack_b3;
  byte bStack_b2;
  byte bStack_b1;
  byte bStack_b0;
  byte bStack_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  byte bStack_aa;
  byte bStack_a9;
  short local_a8;
  short sStack_a6;
  short sStack_a4;
  short sStack_a2;
  short sStack_a0;
  short sStack_9e;
  short sStack_9c;
  short sStack_9a;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  undefined1 local_88 [4];
  short sStack_84;
  short sStack_82;
  short sStack_80;
  short sStack_7e;
  short sStack_7c;
  short sStack_7a;
  __m128i local_78;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined1 auVar41 [12];
  undefined1 auVar42 [15];
  
  GetNotHEV_SSE2(p1,p0,q0,q1,hev_thresh,&local_78);
  uVar17 = *(uint *)((long)*p1 + 4);
  lVar33 = (*p1)[1];
  uVar18 = *(uint *)((long)*p1 + 0xc);
  *(uint *)*p1 = (uint)(*p1)[0] ^ 0x80808080;
  *(uint *)((long)*p1 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*p1 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*p1 + 0xc) = uVar18 ^ 0x80808080;
  uVar17 = *(uint *)((long)*p0 + 4);
  lVar33 = (*p0)[1];
  uVar18 = *(uint *)((long)*p0 + 0xc);
  *(uint *)*p0 = (uint)(*p0)[0] ^ 0x80808080;
  *(uint *)((long)*p0 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*p0 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*p0 + 0xc) = uVar18 ^ 0x80808080;
  uVar17 = *(uint *)((long)*q0 + 4);
  lVar33 = (*q0)[1];
  uVar18 = *(uint *)((long)*q0 + 0xc);
  *(uint *)*q0 = (uint)(*q0)[0] ^ 0x80808080;
  *(uint *)((long)*q0 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*q0 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*q0 + 0xc) = uVar18 ^ 0x80808080;
  uVar17 = *(uint *)((long)*q1 + 4);
  lVar33 = (*q1)[1];
  uVar18 = *(uint *)((long)*q1 + 0xc);
  *(uint *)*q1 = (uint)(*q1)[0] ^ 0x80808080;
  *(uint *)((long)*q1 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*q1 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*q1 + 0xc) = uVar18 ^ 0x80808080;
  uVar17 = *(uint *)((long)*p2 + 4);
  lVar33 = (*p2)[1];
  uVar18 = *(uint *)((long)*p2 + 0xc);
  *(uint *)*p2 = (uint)(*p2)[0] ^ 0x80808080;
  *(uint *)((long)*p2 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*p2 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*p2 + 0xc) = uVar18 ^ 0x80808080;
  uVar17 = *(uint *)((long)*q2 + 4);
  lVar33 = (*q2)[1];
  uVar18 = *(uint *)((long)*q2 + 0xc);
  *(uint *)*q2 = (uint)(*q2)[0] ^ 0x80808080;
  *(uint *)((long)*q2 + 4) = uVar17 ^ 0x80808080;
  *(uint *)(*q2 + 1) = (uint)lVar33 ^ 0x80808080;
  *(uint *)((long)*q2 + 0xc) = uVar18 ^ 0x80808080;
  auVar38 = psubsb((undefined1  [16])*p1,(undefined1  [16])*q1);
  auVar34 = psubsb((undefined1  [16])*q0,(undefined1  [16])*p0);
  auVar38 = paddsb(auVar38,auVar34);
  auVar38 = paddsb(auVar38,auVar34);
  auVar34 = paddsb(auVar38,auVar34);
  _local_88 = (__m128i)(~(undefined1  [16])local_78 & (undefined1  [16])*mask & auVar34);
  DoSimpleFilter_SSE2(p0,q0,(__m128i *)local_88);
  local_c8 = auVar34[0];
  bStack_c7 = auVar34[1];
  bStack_c6 = auVar34[2];
  bStack_c5 = auVar34[3];
  bStack_c4 = auVar34[4];
  bStack_c3 = auVar34[5];
  bStack_c2 = auVar34[6];
  bStack_c1 = auVar34[7];
  bStack_c0 = auVar34[8];
  bStack_bf = auVar34[9];
  bStack_be = auVar34[10];
  bStack_bd = auVar34[0xb];
  bStack_bc = auVar34[0xc];
  bStack_bb = auVar34[0xd];
  bStack_ba = auVar34[0xe];
  bStack_b9 = auVar34[0xf];
  local_b8 = (byte)local_78[0];
  bStack_b7 = local_78[0]._1_1_;
  bStack_b6 = local_78[0]._2_1_;
  bStack_b5 = local_78[0]._3_1_;
  bStack_b4 = local_78[0]._4_1_;
  bStack_b3 = local_78[0]._5_1_;
  bStack_b2 = local_78[0]._6_1_;
  bStack_b1 = local_78[0]._7_1_;
  bStack_b0 = (byte)local_78[1];
  bStack_af = local_78[1]._1_1_;
  bStack_ae = local_78[1]._2_1_;
  bStack_ad = local_78[1]._3_1_;
  bStack_ac = local_78[1]._4_1_;
  bStack_ab = local_78[1]._5_1_;
  bStack_aa = local_78[1]._6_1_;
  bStack_a9 = local_78[1]._7_1_;
  local_b8 = local_c8 & (byte)(*mask)[0] & local_b8;
  bStack_b7 = bStack_c7 & *(byte *)((long)*mask + 1) & bStack_b7;
  bStack_b6 = bStack_c6 & *(byte *)((long)*mask + 2) & bStack_b6;
  bStack_b5 = bStack_c5 & *(byte *)((long)*mask + 3) & bStack_b5;
  bStack_b4 = bStack_c4 & *(byte *)((long)*mask + 4) & bStack_b4;
  bStack_b3 = bStack_c3 & *(byte *)((long)*mask + 5) & bStack_b3;
  bStack_b2 = bStack_c2 & *(byte *)((long)*mask + 6) & bStack_b2;
  bStack_b1 = bStack_c1 & *(byte *)((long)*mask + 7) & bStack_b1;
  bStack_b0 = bStack_c0 & (byte)(*mask)[1] & bStack_b0;
  bStack_af = bStack_bf & *(byte *)((long)*mask + 9) & bStack_af;
  bStack_ae = bStack_be & *(byte *)((long)*mask + 10) & bStack_ae;
  bStack_ad = bStack_bd & *(byte *)((long)*mask + 0xb) & bStack_ad;
  bStack_ac = bStack_bc & *(byte *)((long)*mask + 0xc) & bStack_ac;
  bStack_ab = bStack_bb & *(byte *)((long)*mask + 0xd) & bStack_ab;
  auVar28[10] = 0;
  auVar28._0_10_ = SUB1610((undefined1  [16])0x0,0);
  auVar28[0xb] = bStack_b3;
  auVar29[9] = bStack_b4;
  auVar29._0_9_ = SUB169((undefined1  [16])0x0,0);
  auVar29._10_2_ = auVar28._10_2_;
  auVar30._9_3_ = auVar29._9_3_;
  auVar30._0_9_ = (unkuint9)0;
  auVar13._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar30._8_4_,bStack_b5)) << 0x38,6);
  auVar13[0] = bStack_b6;
  auVar13._11_5_ = 0;
  auVar38._1_12_ = SUB1612(auVar13 << 0x28,4);
  auVar38[0] = bStack_b7;
  auVar38._13_3_ = 0;
  auVar34._1_14_ = SUB1614(auVar38 << 0x18,2);
  auVar34[0] = local_b8;
  auVar34[0xf] = 0;
  auVar34 = auVar34 << 8;
  auVar5[0xd] = 0;
  auVar5._0_13_ = auVar34._0_13_;
  auVar5[0xe] = bStack_b5;
  auVar7[0xc] = 0;
  auVar7._0_12_ = auVar34._0_12_;
  auVar7._13_2_ = auVar5._13_2_;
  auVar9[0xb] = 0;
  auVar9._0_11_ = auVar34._0_11_;
  auVar9._12_3_ = auVar7._12_3_;
  auVar11[10] = bStack_b6;
  auVar11._0_10_ = auVar34._0_10_;
  auVar11._11_4_ = auVar9._11_4_;
  auVar14[9] = 0;
  auVar14._0_9_ = auVar34._0_9_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar16[8] = 0;
  auVar16._0_8_ = auVar34._0_8_;
  auVar16._9_6_ = auVar14._9_6_;
  auVar19._7_8_ = 0;
  auVar19._0_7_ = auVar16._8_7_;
  auVar25._1_8_ = SUB158(auVar19 << 0x40,7);
  auVar25[0] = bStack_b7;
  auVar25._9_6_ = 0;
  auVar32._10_5_ = 0;
  auVar32._0_10_ = SUB1510(auVar25 << 0x30,5);
  auVar20._1_12_ = SUB1512(auVar32 << 0x28,3);
  auVar20[0] = local_b8;
  auVar35._0_4_ = auVar20._0_4_ << 0x10;
  auVar35._8_4_ = auVar16._8_4_;
  auVar35._4_3_ = auVar7._12_3_;
  auVar35[7] = 0;
  auVar35._12_4_ = SUB154(auVar25 << 0x30,5) << 8;
  auVar34 = pshufhw(auVar35,auVar35,0xc4);
  auVar36._0_4_ = auVar34._0_4_;
  auVar36._8_4_ = auVar34._8_4_;
  auVar36._4_4_ = auVar34._12_4_;
  auVar36._12_4_ = auVar34._4_4_;
  auVar36 = auVar36 & _DAT_0017bb80;
  sVar1 = auVar36._0_2_;
  sVar2 = auVar36._2_2_;
  auVar37[1] = (0 < sVar2) * (sVar2 < 0x100) * auVar36[2] - (0xff < sVar2);
  auVar37[0] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0] - (0xff < sVar1);
  sVar1 = auVar36._4_2_;
  auVar37[2] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[4] - (0xff < sVar1);
  sVar1 = auVar36._6_2_;
  auVar37[3] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[6] - (0xff < sVar1);
  sVar1 = auVar36._8_2_;
  auVar37[4] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[8] - (0xff < sVar1);
  sVar1 = auVar36._10_2_;
  auVar37[5] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[10] - (0xff < sVar1);
  sVar1 = auVar36._12_2_;
  auVar37[6] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0xc] - (0xff < sVar1);
  sVar1 = auVar36._14_2_;
  auVar37[7] = (0 < sVar1) * (sVar1 < 0x100) * auVar36[0xe] - (0xff < sVar1);
  auVar37[8] = 0;
  auVar37[9] = (bStack_b4 != 0) * (bStack_b4 < 0x100) * bStack_b4 - (0xff < bStack_b4);
  auVar37[10] = 0;
  auVar37[0xb] = (bStack_b3 != 0) * (bStack_b3 < 0x100) * bStack_b3 - (0xff < bStack_b3);
  auVar37[0xc] = 0;
  auVar37[0xd] = (bStack_b2 != 0) * (bStack_b2 < 0x100) * bStack_b2 - (0xff < bStack_b2);
  auVar37[0xe] = 0;
  auVar37[0xf] = (bStack_b1 != 0) * (bStack_b1 < 0x100) * bStack_b1 - (0xff < bStack_b1);
  auVar39._0_10_ = CONCAT19(bStack_ac,(unkuint9)bStack_ad << 0x38);
  auVar39[10] = 0;
  auVar41[0xb] = bStack_ab;
  auVar41._0_11_ = auVar39;
  auVar40._0_10_ = (unkuint10)bStack_ab << 0x30;
  auVar40[10] = bStack_ba & *(byte *)((long)*mask + 0xe) & bStack_aa;
  auVar42._11_3_ = 0;
  auVar42._0_11_ = auVar40;
  auVar42[0xe] = bStack_b9 & *(byte *)((long)*mask + 0xf) & bStack_a9;
  auVar43._0_4_ = (uint)bStack_ac << 0x10;
  auVar43._4_3_ = auVar42._12_3_;
  auVar43[7] = 0;
  auVar43._8_3_ = auVar40._8_3_;
  auVar43[0xb] = 0;
  auVar43._12_3_ = (int3)(((uint7)bStack_ab << 0x30) >> 0x20);
  auVar43[0xf] = 0;
  auVar34 = pshuflw(auVar43,auVar43,0xc4);
  auVar44._0_4_ = auVar34._0_4_;
  auVar44._8_4_ = auVar34._8_4_;
  auVar44._4_4_ = auVar34._12_4_;
  auVar44._12_4_ = auVar34._4_4_;
  auVar34 = pshufhw(auVar44,auVar44,0xc6);
  auVar34 = auVar34 & _DAT_0017bb90;
  auVar4._12_2_ = 0;
  auVar4._0_12_ = auVar41;
  auVar4[0xe] = bStack_ad;
  auVar6[0xc] = 0;
  auVar6._0_12_ = auVar41;
  auVar6._13_2_ = auVar4._13_2_;
  auVar8[0xb] = 0;
  auVar8._0_11_ = auVar39;
  auVar8._12_3_ = auVar6._12_3_;
  auVar10[10] = bStack_ae;
  auVar10._0_10_ = auVar39._0_10_;
  auVar10._11_4_ = auVar8._11_4_;
  auVar12._10_5_ = auVar10._10_5_;
  auVar12._0_10_ = (unkuint10)bStack_ad << 0x38;
  auVar15._9_6_ = auVar12._9_6_;
  auVar15._0_9_ = (unkuint9)bStack_ad << 0x38;
  auVar21._7_8_ = 0;
  auVar21._0_7_ = auVar15._8_7_;
  Var22 = CONCAT81(SUB158(auVar21 << 0x40,7),bStack_af);
  auVar26._9_6_ = 0;
  auVar26._0_9_ = Var22;
  auVar23._10_5_ = 0;
  auVar23._0_10_ = SUB1510(auVar26 << 0x30,5);
  auVar24._11_4_ = 0;
  auVar24._0_11_ = SUB1511(auVar23 << 0x28,4);
  auVar27._1_12_ = SUB1512(auVar24 << 0x20,3);
  auVar27[0] = bStack_b0;
  uVar3 = auVar27._0_2_;
  auVar31[1] = 0;
  auVar31[0] = (uVar3 != 0) * (uVar3 < 0x100) * bStack_b0 - (0xff < uVar3);
  uVar3 = (ushort)Var22;
  auVar31[2] = (uVar3 != 0) * (uVar3 < 0x100) * bStack_af - (0xff < uVar3);
  auVar31[3] = -(0xff < auVar15._8_2_);
  sVar1 = auVar10._10_2_;
  auVar31[4] = (0 < sVar1) * (sVar1 < 0x100) * bStack_ae - (0xff < sVar1);
  auVar31[5] = -(0xff < auVar6._12_2_);
  auVar31[6] = (bStack_ad != 0) * (bStack_ad < 0x100) * bStack_ad - (0xff < bStack_ad);
  sVar1 = auVar34._0_2_;
  auVar31[7] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[0] - (0xff < sVar1);
  sVar1 = auVar34._2_2_;
  auVar31[8] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[2] - (0xff < sVar1);
  sVar1 = auVar34._4_2_;
  auVar31[9] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[4] - (0xff < sVar1);
  sVar1 = auVar34._6_2_;
  auVar31[10] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[6] - (0xff < sVar1);
  sVar1 = auVar34._8_2_;
  auVar31[0xb] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[8] - (0xff < sVar1);
  sVar1 = auVar34._10_2_;
  auVar31[0xc] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[10] - (0xff < sVar1);
  sVar1 = auVar34._12_2_;
  auVar31[0xd] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[0xc] - (0xff < sVar1);
  sVar1 = auVar34._14_2_;
  auVar31[0xe] = (0 < sVar1) * (sVar1 < 0x100) * auVar34[0xe] - (0xff < sVar1);
  auVar31[0xf] = 0;
  auVar34 = pmulhw(auVar37,_DAT_0017bc20);
  auVar38 = pmulhw(auVar31 << 8,_DAT_0017bc20);
  local_a8 = auVar34._0_2_;
  sStack_a6 = auVar34._2_2_;
  sStack_a4 = auVar34._4_2_;
  sStack_a2 = auVar34._6_2_;
  sStack_a0 = auVar34._8_2_;
  sStack_9e = auVar34._10_2_;
  sStack_9c = auVar34._12_2_;
  sStack_9a = auVar34._14_2_;
  local_88._2_2_ = sStack_a6 + 0x3f;
  local_88._0_2_ = local_a8 + 0x3f;
  sStack_84 = sStack_a4 + 0x3f;
  sStack_82 = sStack_a2 + 0x3f;
  sStack_80 = sStack_a0 + 0x3f;
  sStack_7e = sStack_9e + 0x3f;
  sStack_7c = sStack_9c + 0x3f;
  sStack_7a = sStack_9a + 0x3f;
  local_68 = auVar38._0_2_;
  local_48 = local_68 + 0x3f;
  sStack_66 = auVar38._2_2_;
  sStack_46 = sStack_66 + 0x3f;
  sStack_64 = auVar38._4_2_;
  sStack_44 = sStack_64 + 0x3f;
  sStack_62 = auVar38._6_2_;
  sStack_42 = sStack_62 + 0x3f;
  sStack_60 = auVar38._8_2_;
  sStack_40 = sStack_60 + 0x3f;
  sStack_5e = auVar38._10_2_;
  sStack_3e = sStack_5e + 0x3f;
  sStack_5c = auVar38._12_2_;
  sStack_3c = sStack_5c + 0x3f;
  sStack_5a = auVar38._14_2_;
  sStack_3a = sStack_5a + 0x3f;
  local_98 = local_a8 + 0x3f + local_a8;
  sStack_96 = sStack_a6 + 0x3f + sStack_a6;
  sStack_94 = sStack_a4 + 0x3f + sStack_a4;
  sStack_92 = sStack_a2 + 0x3f + sStack_a2;
  sStack_90 = sStack_a0 + 0x3f + sStack_a0;
  sStack_8e = sStack_9e + 0x3f + sStack_9e;
  sStack_8c = sStack_9c + 0x3f + sStack_9c;
  sStack_8a = sStack_9a + 0x3f + sStack_9a;
  local_58 = local_48 + local_68;
  sStack_56 = sStack_46 + sStack_66;
  sStack_54 = sStack_44 + sStack_64;
  sStack_52 = sStack_42 + sStack_62;
  sStack_50 = sStack_40 + sStack_60;
  sStack_4e = sStack_3e + sStack_5e;
  sStack_4c = sStack_3c + sStack_5c;
  sStack_4a = sStack_3a + sStack_5a;
  local_a8 = local_98 + local_a8;
  sStack_a6 = sStack_96 + sStack_a6;
  sStack_a4 = sStack_94 + sStack_a4;
  sStack_a2 = sStack_92 + sStack_a2;
  sStack_a0 = sStack_90 + sStack_a0;
  sStack_9e = sStack_8e + sStack_9e;
  sStack_9c = sStack_8c + sStack_9c;
  sStack_9a = sStack_8a + sStack_9a;
  local_68 = local_58 + local_68;
  sStack_66 = sStack_56 + sStack_66;
  sStack_64 = sStack_54 + sStack_64;
  sStack_62 = sStack_52 + sStack_62;
  sStack_60 = sStack_50 + sStack_60;
  sStack_5e = sStack_4e + sStack_5e;
  sStack_5c = sStack_4c + sStack_5c;
  sStack_5a = sStack_4a + sStack_5a;
  Update2Pixels_SSE2(p2,q2,(__m128i *)local_88,(__m128i *)&local_48);
  Update2Pixels_SSE2(p1,q1,(__m128i *)&local_98,(__m128i *)&local_58);
  Update2Pixels_SSE2(p0,q0,(__m128i *)&local_a8,(__m128i *)&local_68);
  return;
}

Assistant:

static WEBP_INLINE void DoFilter6_SSE2(__m128i* const p2, __m128i* const p1,
                                       __m128i* const p0, __m128i* const q0,
                                       __m128i* const q1, __m128i* const q2,
                                       const __m128i* const mask,
                                       int hev_thresh) {
  const __m128i zero = _mm_setzero_si128();
  const __m128i sign_bit = _mm_set1_epi8((char)0x80);
  __m128i a, not_hev;

  // compute hev mask
  GetNotHEV_SSE2(p1, p0, q0, q1, hev_thresh, &not_hev);

  FLIP_SIGN_BIT4(*p1, *p0, *q0, *q1);
  FLIP_SIGN_BIT2(*p2, *q2);
  GetBaseDelta_SSE2(p1, p0, q0, q1, &a);

  { // do simple filter on pixels with hev
    const __m128i m = _mm_andnot_si128(not_hev, *mask);
    const __m128i f = _mm_and_si128(a, m);
    DoSimpleFilter_SSE2(p0, q0, &f);
  }

  { // do strong filter on pixels with not hev
    const __m128i k9 = _mm_set1_epi16(0x0900);
    const __m128i k63 = _mm_set1_epi16(63);

    const __m128i m = _mm_and_si128(not_hev, *mask);
    const __m128i f = _mm_and_si128(a, m);

    const __m128i f_lo = _mm_unpacklo_epi8(zero, f);
    const __m128i f_hi = _mm_unpackhi_epi8(zero, f);

    const __m128i f9_lo = _mm_mulhi_epi16(f_lo, k9);    // Filter (lo) * 9
    const __m128i f9_hi = _mm_mulhi_epi16(f_hi, k9);    // Filter (hi) * 9

    const __m128i a2_lo = _mm_add_epi16(f9_lo, k63);    // Filter * 9 + 63
    const __m128i a2_hi = _mm_add_epi16(f9_hi, k63);    // Filter * 9 + 63

    const __m128i a1_lo = _mm_add_epi16(a2_lo, f9_lo);  // Filter * 18 + 63
    const __m128i a1_hi = _mm_add_epi16(a2_hi, f9_hi);  // Filter * 18 + 63

    const __m128i a0_lo = _mm_add_epi16(a1_lo, f9_lo);  // Filter * 27 + 63
    const __m128i a0_hi = _mm_add_epi16(a1_hi, f9_hi);  // Filter * 27 + 63

    Update2Pixels_SSE2(p2, q2, &a2_lo, &a2_hi);
    Update2Pixels_SSE2(p1, q1, &a1_lo, &a1_hi);
    Update2Pixels_SSE2(p0, q0, &a0_lo, &a0_hi);
  }
}